

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
lower_bound<int>(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *this,int *key)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined8 in_XMM0_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  this->num_lookups_ = this->num_lookups_ + 1;
  iVar2 = *key;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
  auVar12._0_8_ = (double)iVar2;
  auVar12._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
  auVar1 = vfmadd213sd_fma(auVar12,auVar13,auVar1);
  uVar7 = this->data_capacity_ - 1;
  uVar4 = (int)auVar1._0_8_;
  if ((int)uVar7 < (int)auVar1._0_8_) {
    uVar4 = uVar7;
  }
  uVar7 = ~((int)uVar4 >> 0x1f) & uVar4;
  piVar3 = this->key_slots_;
  if (piVar3[uVar7] < iVar2) {
    iVar10 = this->data_capacity_ - uVar7;
    iVar9 = 1;
    if (1 < iVar10) {
      lVar6 = this->num_exp_search_iterations_;
      iVar9 = 1;
      do {
        lVar6 = lVar6 + 1;
        if (iVar2 <= piVar3[(int)(iVar9 + uVar7)]) break;
        this->num_exp_search_iterations_ = lVar6;
        iVar9 = iVar9 * 2;
      } while (iVar9 < iVar10);
    }
    iVar5 = iVar9 / 2;
    if (iVar10 < iVar9) {
      iVar9 = iVar10;
    }
  }
  else {
    uVar11 = 1;
    if (1 < (int)uVar4) {
      lVar6 = this->num_exp_search_iterations_;
      do {
        lVar6 = lVar6 + 1;
        if (piVar3[(int)(uVar7 - uVar11)] < iVar2) break;
        this->num_exp_search_iterations_ = lVar6;
        uVar11 = uVar11 * 2;
      } while ((int)uVar11 < (int)uVar7);
    }
    uVar4 = uVar7;
    if ((int)uVar11 < (int)uVar7) {
      uVar4 = uVar11;
    }
    iVar5 = -uVar4;
    iVar9 = -((int)uVar11 / 2);
  }
  iVar5 = iVar5 + uVar7;
  iVar9 = iVar9 + uVar7;
  while (iVar10 = iVar9, iVar5 < iVar10) {
    iVar8 = (iVar10 - iVar5) / 2;
    iVar9 = iVar8 + iVar5;
    if (piVar3[iVar9] < iVar2) {
      iVar5 = iVar8 + 1 + iVar5;
      iVar9 = iVar10;
    }
  }
  return iVar5;
}

Assistant:

int lower_bound(const K& key) {
    num_lookups_++;
    int position = predict_position(key);
    return exponential_search_lower_bound(position, key);
  }